

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O0

void __thiscall arangodb::velocypack::Dumper::appendDouble(Dumper *this,double v)

{
  int iVar1;
  long in_RDI;
  longdouble in_ST0;
  longdouble lVar2;
  longdouble in_ST1;
  double in_XMM0_Qa;
  int len;
  uint64_t u;
  double a;
  char temp [24];
  uint64_t v_00;
  undefined2 uVar3;
  undefined6 in_stack_ffffffffffffff92;
  undefined8 local_48;
  undefined2 uVar4;
  undefined2 in_stack_ffffffffffffffc2;
  undefined4 in_stack_ffffffffffffffc4;
  double in_stack_ffffffffffffffc8;
  undefined1 local_28 [24];
  double local_10;
  
  lVar2 = (longdouble)ABS(in_XMM0_Qa);
  local_48 = SUB108(lVar2,0);
  uVar4 = (undefined2)((unkuint10)lVar2 >> 0x40);
  local_10 = in_XMM0_Qa;
  ldexpl(0x35);
  if (in_ST0 <= (longdouble)CONCAT28(uVar4,local_48)) {
    v_00 = SUB108((longdouble)1,0);
    uVar3 = (undefined2)((unkuint10)(longdouble)1 >> 0x40);
    ldexpl(0x40);
    if ((longdouble)ABS(in_XMM0_Qa) < in_ST1) {
      if (local_10 < 0.0) {
        (**(code **)(**(long **)(in_RDI + 8) + 0x18))(*(long **)(in_RDI + 8),"-",1);
      }
      appendUInt((Dumper *)CONCAT62(in_stack_ffffffffffffff92,uVar3),v_00);
      (**(code **)(**(long **)(in_RDI + 8) + 0x18))(*(long **)(in_RDI + 8),".0",2);
      return;
    }
  }
  iVar1 = fpconv_dtoa(in_stack_ffffffffffffffc8,
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,
                                       CONCAT22(in_stack_ffffffffffffffc2,uVar4)));
  (**(code **)(**(long **)(in_RDI + 8) + 0x18))(*(long **)(in_RDI + 8),local_28,(long)iVar1);
  return;
}

Assistant:

void Dumper::appendDouble(double v) {
  char temp[24];
  double a = fabs(v);
  if (a >= ldexpl(1.0, 53) && a < ldexpl(1.0, 64)) {
    // This is a special case which we want to handle separately, because
    // of two reasons:
    //  (1) The function fpconv_dtoa below only guarantees to write a
    //      decimal representation which gives the same double value when
    //      parsed back into a double. It can write a wrong integer.
    //      Therefore we want to use the integer code in this case.
    //  (2) The function fpconv_dtoa will write a normal integer
    //      representation in this case without a decimal point. If we
    //      parse this back to vpack later, we end up in a different
    //      representation (uint64_t or int64_t), so we want to append
    //      ".0" to the string in this case.
    // Note that this automatically excludes all infinities and NaNs,
    // which will be handled in the function fpconv_dtoa below.
    uint64_t u;
    if (v < 0) {
      u = static_cast<uint64_t>(-v);
      _sink->append("-", 1);
    } else {
      u = static_cast<uint64_t>(v);
    }
    appendUInt(u);
    _sink->append(".0", 2);
    return;
  }
  int len = fpconv_dtoa(v, &temp[0]);
  _sink->append(&temp[0], static_cast<ValueLength>(len));
}